

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void run_schnorrsig_bench(int iters,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  undefined1 *puVar3;
  void *pvVar4;
  void *pvVar5;
  int in_ESI;
  int in_EDI;
  secp256k1_xonly_pubkey pk;
  uchar *pk_char;
  secp256k1_keypair *keypair;
  uchar *sig;
  uchar *msg;
  uchar sk [32];
  int d;
  bench_schnorrsig_data data;
  int i;
  char *in_stack_ffffffffffffff20;
  char **in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  void *in_stack_ffffffffffffff40;
  _func_void_void_ptr_int *in_stack_ffffffffffffff48;
  _func_void_void_ptr *in_stack_ffffffffffffff50;
  _func_void_void_ptr_int *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff70;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 auStack_74 [40];
  uint local_4c;
  undefined8 local_48;
  void *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  int local_14;
  int local_4;
  
  local_4c = (uint)(in_ESI == 1);
  local_4 = in_EDI;
  local_48 = secp256k1_context_create(1);
  local_38 = malloc((long)local_4 << 3);
  local_30 = malloc((long)local_4 << 3);
  local_20 = malloc((long)local_4 << 3);
  local_28 = malloc((long)local_4 << 3);
  for (local_14 = 0; iVar1 = (int)in_stack_ffffffffffffff70, local_14 < local_4;
      local_14 = local_14 + 1) {
    puVar3 = (undefined1 *)malloc(0x20);
    pvVar4 = malloc(0x40);
    in_stack_ffffffffffffff70 = malloc(0x60);
    pvVar5 = malloc(0x20);
    local_78 = (undefined1)local_14;
    *puVar3 = local_78;
    local_77 = (undefined1)((uint)local_14 >> 8);
    puVar3[1] = local_77;
    local_76 = (undefined1)((uint)local_14 >> 0x10);
    puVar3[2] = local_76;
    local_75 = (undefined1)((uint)local_14 >> 0x18);
    puVar3[3] = local_75;
    memset(puVar3 + 4,0x6d,0x1c);
    memset(auStack_74,0x73,0x1c);
    *(void **)((long)local_38 + (long)local_14 * 8) = in_stack_ffffffffffffff70;
    *(void **)((long)local_30 + (long)local_14 * 8) = pvVar5;
    *(undefined1 **)((long)local_20 + (long)local_14 * 8) = puVar3;
    *(void **)((long)local_28 + (long)local_14 * 8) = pvVar4;
    iVar1 = secp256k1_keypair_create(local_48,in_stack_ffffffffffffff70,&local_78);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/bench_impl.h"
              ,0x4f,"test condition failed: secp256k1_keypair_create(data.ctx, keypair, sk)");
      abort();
    }
    iVar1 = secp256k1_schnorrsig_sign_custom
                      (local_48,pvVar4,puVar3,0x20,in_stack_ffffffffffffff70,0);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/bench_impl.h"
              ,0x50,
              "test condition failed: secp256k1_schnorrsig_sign_custom(data.ctx, sig, msg, MSGLEN, keypair, NULL)"
             );
      abort();
    }
    iVar1 = secp256k1_keypair_xonly_pub
                      (local_48,&stack0xffffffffffffff28,0,in_stack_ffffffffffffff70);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/bench_impl.h"
              ,0x51,
              "test condition failed: secp256k1_keypair_xonly_pub(data.ctx, &pk, NULL, keypair)");
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_serialize(local_48,pvVar5,&stack0xffffffffffffff28);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/bench_impl.h"
              ,0x52,
              "test condition failed: secp256k1_xonly_pubkey_serialize(data.ctx, pk_char, &pk) == 1"
             );
      abort();
    }
  }
  if (local_4c == 0) {
    iVar2 = have_flag(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20)
    ;
    if (iVar2 != 0) goto LAB_001043a2;
    iVar2 = have_flag(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20)
    ;
    if (iVar2 != 0) goto LAB_001043a2;
    iVar2 = have_flag(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20)
    ;
    if (iVar2 != 0) goto LAB_001043a2;
  }
  else {
LAB_001043a2:
    run_benchmark(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                  in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                  iVar1);
  }
  if (local_4c == 0) {
    iVar2 = have_flag(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20)
    ;
    if (iVar2 == 0) {
      iVar2 = have_flag(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        in_stack_ffffffffffffff20);
      if (iVar2 == 0) {
        iVar2 = have_flag(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                          in_stack_ffffffffffffff20);
        if (iVar2 == 0) goto LAB_0010446c;
      }
    }
  }
  run_benchmark(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,iVar1)
  ;
LAB_0010446c:
  for (local_14 = 0; local_14 < local_4; local_14 = local_14 + 1) {
    free(*(void **)((long)local_38 + (long)local_14 * 8));
    free(*(void **)((long)local_30 + (long)local_14 * 8));
    free(*(void **)((long)local_20 + (long)local_14 * 8));
    free(*(void **)((long)local_28 + (long)local_14 * 8));
  }
  free(local_38);
  free(local_30);
  free(local_20);
  free(local_28);
  secp256k1_context_destroy(local_48);
  return;
}

Assistant:

static void run_schnorrsig_bench(int iters, int argc, char** argv) {
    int i;
    bench_schnorrsig_data data;
    int d = argc == 1;

    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    data.keypairs = (const secp256k1_keypair **)malloc(iters * sizeof(secp256k1_keypair *));
    data.pk = (const unsigned char **)malloc(iters * sizeof(unsigned char *));
    data.msgs = (const unsigned char **)malloc(iters * sizeof(unsigned char *));
    data.sigs = (const unsigned char **)malloc(iters * sizeof(unsigned char *));

    CHECK(MSGLEN >= 4);
    for (i = 0; i < iters; i++) {
        unsigned char sk[32];
        unsigned char *msg = (unsigned char *)malloc(MSGLEN);
        unsigned char *sig = (unsigned char *)malloc(64);
        secp256k1_keypair *keypair = (secp256k1_keypair *)malloc(sizeof(*keypair));
        unsigned char *pk_char = (unsigned char *)malloc(32);
        secp256k1_xonly_pubkey pk;
        msg[0] = sk[0] = i;
        msg[1] = sk[1] = i >> 8;
        msg[2] = sk[2] = i >> 16;
        msg[3] = sk[3] = i >> 24;
        memset(&msg[4], 'm', MSGLEN - 4);
        memset(&sk[4], 's', 28);

        data.keypairs[i] = keypair;
        data.pk[i] = pk_char;
        data.msgs[i] = msg;
        data.sigs[i] = sig;

        CHECK(secp256k1_keypair_create(data.ctx, keypair, sk));
        CHECK(secp256k1_schnorrsig_sign_custom(data.ctx, sig, msg, MSGLEN, keypair, NULL));
        CHECK(secp256k1_keypair_xonly_pub(data.ctx, &pk, NULL, keypair));
        CHECK(secp256k1_xonly_pubkey_serialize(data.ctx, pk_char, &pk) == 1);
    }

    if (d || have_flag(argc, argv, "schnorrsig") || have_flag(argc, argv, "sign") || have_flag(argc, argv, "schnorrsig_sign")) run_benchmark("schnorrsig_sign", bench_schnorrsig_sign, NULL, NULL, (void *) &data, 10, iters);
    if (d || have_flag(argc, argv, "schnorrsig") || have_flag(argc, argv, "verify") || have_flag(argc, argv, "schnorrsig_verify")) run_benchmark("schnorrsig_verify", bench_schnorrsig_verify, NULL, NULL, (void *) &data, 10, iters);

    for (i = 0; i < iters; i++) {
        free((void *)data.keypairs[i]);
        free((void *)data.pk[i]);
        free((void *)data.msgs[i]);
        free((void *)data.sigs[i]);
    }

    /* Casting to (void *) avoids a stupid warning in MSVC. */
    free((void *)data.keypairs);
    free((void *)data.pk);
    free((void *)data.msgs);
    free((void *)data.sigs);

    secp256k1_context_destroy(data.ctx);
}